

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *__s;
  uint32_t uVar1;
  int32_t iVar2;
  int iVar3;
  int *useDefaultScalingMatrixFlag;
  int i;
  ulong uVar4;
  long lVar5;
  int (*paiVar6) [16];
  int (*scalingList) [16];
  int (*paiVar7) [16];
  int *piVar8;
  
  __s = h->pps;
  memset(__s,0,0x87c);
  uVar1 = bs_read_ue(b);
  __s->pic_parameter_set_id = uVar1;
  uVar1 = bs_read_ue(b);
  __s->seq_parameter_set_id = uVar1;
  uVar1 = bs_read_u1(b);
  __s->entropy_coding_mode_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->pic_order_present_flag = uVar1;
  uVar1 = bs_read_ue(b);
  __s->num_slice_groups_minus1 = uVar1;
  if (0 < (int)uVar1) {
    uVar1 = bs_read_ue(b);
    __s->slice_group_map_type = uVar1;
    switch(uVar1) {
    case 0:
      for (lVar5 = 0; lVar5 <= __s->num_slice_groups_minus1; lVar5 = lVar5 + 1) {
        uVar1 = bs_read_ue(b);
        __s->run_length_minus1[lVar5] = uVar1;
      }
      break;
    case 2:
      for (lVar5 = 0; lVar5 < __s->num_slice_groups_minus1; lVar5 = lVar5 + 1) {
        uVar1 = bs_read_ue(b);
        __s->top_left[lVar5] = uVar1;
        uVar1 = bs_read_ue(b);
        __s->bottom_right[lVar5] = uVar1;
      }
      break;
    case 3:
    case 4:
    case 5:
      uVar1 = bs_read_u1(b);
      __s->slice_group_change_direction_flag = uVar1;
      uVar1 = bs_read_ue(b);
      __s->slice_group_change_rate_minus1 = uVar1;
      break;
    case 6:
      uVar1 = bs_read_ue(b);
      __s->pic_size_in_map_units_minus1 = uVar1;
      for (lVar5 = 0; lVar5 <= (int)uVar1; lVar5 = lVar5 + 1) {
        iVar3 = intlog2(__s->num_slice_groups_minus1 + 1);
        uVar1 = bs_read_u(b,iVar3);
        __s->slice_group_id[lVar5] = uVar1;
        uVar1 = __s->pic_size_in_map_units_minus1;
      }
    }
  }
  uVar1 = bs_read_ue(b);
  __s->num_ref_idx_l0_active_minus1 = uVar1;
  uVar1 = bs_read_ue(b);
  __s->num_ref_idx_l1_active_minus1 = uVar1;
  uVar1 = bs_read_u1(b);
  __s->weighted_pred_flag = uVar1;
  uVar1 = bs_read_u(b,2);
  __s->weighted_bipred_idc = uVar1;
  iVar2 = bs_read_se(b);
  __s->pic_init_qp_minus26 = iVar2;
  iVar2 = bs_read_se(b);
  __s->pic_init_qs_minus26 = iVar2;
  iVar2 = bs_read_se(b);
  __s->chroma_qp_index_offset = iVar2;
  uVar1 = bs_read_u1(b);
  __s->deblocking_filter_control_present_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->constrained_intra_pred_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->redundant_pic_cnt_present_flag = uVar1;
  iVar3 = more_rbsp_data(b);
  if (iVar3 != 0) {
    uVar1 = bs_read_u1(b);
    __s->transform_8x8_mode_flag = uVar1;
    uVar1 = bs_read_u1(b);
    __s->pic_scaling_matrix_present_flag = uVar1;
    if (uVar1 != 0) {
      paiVar7 = __s->ScalingList4x4;
      piVar8 = __s->ScalingList8x8[1] + 0x3a;
      paiVar6 = (int (*) [16])(__s->bottom_right + 6);
      for (uVar4 = 0; (long)uVar4 < (long)__s->transform_8x8_mode_flag * 2 + 6; uVar4 = uVar4 + 1) {
        uVar1 = bs_read_u1(b);
        piVar8[-0xe8] = uVar1;
        if (uVar1 != 0) {
          if (uVar4 < 6) {
            iVar3 = 0x10;
            useDefaultScalingMatrixFlag = piVar8 + -0x80;
            scalingList = paiVar7;
          }
          else {
            iVar3 = 0x40;
            useDefaultScalingMatrixFlag = piVar8;
            scalingList = paiVar6;
          }
          read_scaling_list(b,*scalingList,iVar3,useDefaultScalingMatrixFlag);
        }
        piVar8 = piVar8 + 1;
        paiVar6 = paiVar6 + 4;
        paiVar7 = paiVar7 + 1;
      }
    }
    iVar2 = bs_read_se(b);
    __s->second_chroma_qp_index_offset = iVar2;
  }
  memcpy(h->pps_table[__s->pic_parameter_set_id],h->pps,0x87c);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 1 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    pps->pic_parameter_set_id = bs_read_ue(b);
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);
    pps->pic_order_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                pps->slice_group_id[ i ] = bs_read_u(b, v);
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b, 2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    int have_more_data = 0;
    if( 1 ) { have_more_data = more_rbsp_data(b); }
    if( 0 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }

    if( 1 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}